

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraph::TestPreset::VisitPresetInherit(TestPreset *this,Preset *parentPreset)

{
  bool bVar1;
  OutputOptions *child;
  OutputOptions *parent_00;
  FilterOptions *pFVar2;
  IncludeOptions *child_00;
  IncludeOptions *parent_01;
  ExcludeOptions *child_01;
  ExcludeOptions *parent_02;
  FilterOptions *pFVar3;
  ExecutionOptions *child_02;
  ExecutionOptions *parent_03;
  ExecutionOptions *parentExecution;
  ExecutionOptions *execution;
  ExcludeOptions *parentExclude;
  ExcludeOptions *exclude;
  IncludeOptions *parentInclude;
  IncludeOptions *include;
  OutputOptions *parentOutput;
  OutputOptions *output;
  TestPreset *parent;
  TestPreset *preset;
  Preset *parentPreset_local;
  TestPreset *this_local;
  
  anon_unknown.dwarf_441bd5::InheritString(&this->ConfigurePreset,(string *)(parentPreset + 1));
  anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
            (&this->InheritConfigureEnvironment,
             (optional<bool> *)((long)&parentPreset[1].Name.field_2 + 8));
  anon_unknown.dwarf_441bd5::InheritString(&this->Configuration,(string *)&parentPreset[1].Inherits)
  ;
  (anonymous_namespace)::InheritVector<std::__cxx11::string>
            (&this->OverwriteConfigurationFile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parentPreset[1].OriginFile);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)parentPreset[1].DisplayName.field_2._M_local_buf);
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->Output);
    if (bVar1) {
      child = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::value(&this->Output);
      parent_00 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::value
                            ((optional<cmCMakePresetsGraph::TestPreset::OutputOptions> *)
                             &parentPreset[1].DisplayName.field_2);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
                (&child->ShortProgress,&parent_00->ShortProgress);
      anon_unknown.dwarf_441bd5::
      InheritOptionalValue<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum>
                (&child->Verbosity,&parent_00->Verbosity);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>(&child->Debug,&parent_00->Debug);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
                (&child->OutputOnFailure,&parent_00->OutputOnFailure);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>(&child->Quiet,&parent_00->Quiet);
      anon_unknown.dwarf_441bd5::InheritString(&child->OutputLogFile,&parent_00->OutputLogFile);
      anon_unknown.dwarf_441bd5::InheritString(&child->OutputJUnitFile,&parent_00->OutputJUnitFile);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
                (&child->LabelSummary,&parent_00->LabelSummary);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
                (&child->SubprojectSummary,&parent_00->SubprojectSummary);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<int>
                (&child->MaxPassedTestOutputSize,&parent_00->MaxPassedTestOutputSize);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<int>
                (&child->MaxFailedTestOutputSize,&parent_00->MaxFailedTestOutputSize);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<cmCTestTypes::TruncationMode>
                (&child->TestOutputTruncation,&parent_00->TestOutputTruncation);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<int>
                (&child->MaxTestNameWidth,&parent_00->MaxTestNameWidth);
    }
    else {
      std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator=
                (&this->Output,
                 (optional<cmCMakePresetsGraph::TestPreset::OutputOptions> *)
                 &parentPreset[1].DisplayName.field_2);
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)&parentPreset[2].Name._M_string_length);
  if (!bVar1) goto LAB_00336870;
  pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                     ((optional<cmCMakePresetsGraph::TestPreset::FilterOptions> *)
                      &parentPreset[2].Name._M_string_length);
  bVar1 = std::optional::operator_cast_to_bool((optional *)pFVar2);
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->Filter);
    if (bVar1) {
      pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                         (&this->Filter);
      bVar1 = std::optional::operator_cast_to_bool((optional *)pFVar2);
      if (bVar1) {
        pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                           (&this->Filter);
        child_00 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator*
                             (&pFVar2->Include);
        pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                           ((optional<cmCMakePresetsGraph::TestPreset::FilterOptions> *)
                            &parentPreset[2].Name._M_string_length);
        parent_01 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator*
                              (&pFVar2->Include);
        anon_unknown.dwarf_441bd5::InheritString(&child_00->Name,&parent_01->Name);
        anon_unknown.dwarf_441bd5::InheritString(&child_00->Label,&parent_01->Label);
        anon_unknown.dwarf_441bd5::
        InheritOptionalValue<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                  (&child_00->Index,&parent_01->Index);
        goto LAB_00336726;
      }
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->Filter);
    if (!bVar1) {
      std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::emplace<>(&this->Filter);
    }
    pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                       ((optional<cmCMakePresetsGraph::TestPreset::FilterOptions> *)
                        &parentPreset[2].Name._M_string_length);
    pFVar3 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                       (&this->Filter);
    std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator=
              (&pFVar3->Include,&pFVar2->Include);
  }
LAB_00336726:
  pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                     ((optional<cmCMakePresetsGraph::TestPreset::FilterOptions> *)
                      &parentPreset[2].Name._M_string_length);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&pFVar2->Exclude);
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->Filter);
    if (bVar1) {
      pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                         (&this->Filter);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&pFVar2->Exclude);
      if (bVar1) {
        pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                           (&this->Filter);
        child_01 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator*
                             (&pFVar2->Exclude);
        pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                           ((optional<cmCMakePresetsGraph::TestPreset::FilterOptions> *)
                            &parentPreset[2].Name._M_string_length);
        parent_02 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator*
                              (&pFVar2->Exclude);
        anon_unknown.dwarf_441bd5::InheritString(&child_01->Name,&parent_02->Name);
        anon_unknown.dwarf_441bd5::InheritString(&child_01->Label,&parent_02->Label);
        anon_unknown.dwarf_441bd5::
        InheritOptionalValue<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
                  (&child_01->Fixtures,&parent_02->Fixtures);
        goto LAB_00336870;
      }
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->Filter);
    if (!bVar1) {
      std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::emplace<>(&this->Filter);
    }
    pFVar2 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                       ((optional<cmCMakePresetsGraph::TestPreset::FilterOptions> *)
                        &parentPreset[2].Name._M_string_length);
    pFVar3 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                       (&this->Filter);
    std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator=
              (&pFVar3->Exclude,&pFVar2->Exclude);
  }
LAB_00336870:
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &parentPreset[3].ConditionEvaluator.
                      super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->Execution);
    if (bVar1) {
      child_02 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator*
                           (&this->Execution);
      parent_03 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator*
                            ((optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions> *)
                             &parentPreset[3].ConditionEvaluator.
                              super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
                (&child_02->StopOnFailure,&parent_03->StopOnFailure);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
                (&child_02->EnableFailover,&parent_03->EnableFailover);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<int>(&child_02->Jobs,&parent_03->Jobs);
      anon_unknown.dwarf_441bd5::InheritString
                (&child_02->ResourceSpecFile,&parent_03->ResourceSpecFile);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<int>(&child_02->TestLoad,&parent_03->TestLoad)
      ;
      anon_unknown.dwarf_441bd5::
      InheritOptionalValue<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum>
                (&child_02->ShowOnly,&parent_03->ShowOnly);
      anon_unknown.dwarf_441bd5::
      InheritOptionalValue<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions>
                (&child_02->Repeat,&parent_03->Repeat);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
                (&child_02->InteractiveDebugging,&parent_03->InteractiveDebugging);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<bool>
                (&child_02->ScheduleRandom,&parent_03->ScheduleRandom);
      anon_unknown.dwarf_441bd5::InheritOptionalValue<int>(&child_02->Timeout,&parent_03->Timeout);
      anon_unknown.dwarf_441bd5::
      InheritOptionalValue<cmCMakePresetsGraph::TestPreset::ExecutionOptions::NoTestsActionEnum>
                (&child_02->NoTestsAction,&parent_03->NoTestsAction);
    }
    else {
      std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator=
                (&this->Execution,
                 (optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions> *)
                 &parentPreset[3].ConditionEvaluator.
                  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  return true;
}

Assistant:

bool cmCMakePresetsGraph::TestPreset::VisitPresetInherit(
  const cmCMakePresetsGraph::Preset& parentPreset)
{
  auto& preset = *this;
  const TestPreset& parent = static_cast<const TestPreset&>(parentPreset);

  InheritString(preset.ConfigurePreset, parent.ConfigurePreset);
  InheritOptionalValue(preset.InheritConfigureEnvironment,
                       parent.InheritConfigureEnvironment);
  InheritString(preset.Configuration, parent.Configuration);
  InheritVector(preset.OverwriteConfigurationFile,
                parent.OverwriteConfigurationFile);

  if (parent.Output) {
    if (preset.Output) {
      auto& output = preset.Output.value();
      const auto& parentOutput = parent.Output.value();
      InheritOptionalValue(output.ShortProgress, parentOutput.ShortProgress);
      InheritOptionalValue(output.Verbosity, parentOutput.Verbosity);
      InheritOptionalValue(output.Debug, parentOutput.Debug);
      InheritOptionalValue(output.OutputOnFailure,
                           parentOutput.OutputOnFailure);
      InheritOptionalValue(output.Quiet, parentOutput.Quiet);
      InheritString(output.OutputLogFile, parentOutput.OutputLogFile);
      InheritString(output.OutputJUnitFile, parentOutput.OutputJUnitFile);
      InheritOptionalValue(output.LabelSummary, parentOutput.LabelSummary);
      InheritOptionalValue(output.SubprojectSummary,
                           parentOutput.SubprojectSummary);
      InheritOptionalValue(output.MaxPassedTestOutputSize,
                           parentOutput.MaxPassedTestOutputSize);
      InheritOptionalValue(output.MaxFailedTestOutputSize,
                           parentOutput.MaxFailedTestOutputSize);
      InheritOptionalValue(output.TestOutputTruncation,
                           parentOutput.TestOutputTruncation);
      InheritOptionalValue(output.MaxTestNameWidth,
                           parentOutput.MaxTestNameWidth);
    } else {
      preset.Output = parent.Output;
    }
  }

  if (parent.Filter) {
    if (parent.Filter->Include) {
      if (preset.Filter && preset.Filter->Include) {
        auto& include = *preset.Filter->Include;
        const auto& parentInclude = *parent.Filter->Include;
        InheritString(include.Name, parentInclude.Name);
        InheritString(include.Label, parentInclude.Label);
        InheritOptionalValue(include.Index, parentInclude.Index);
      } else {
        if (!preset.Filter) {
          preset.Filter.emplace();
        }
        preset.Filter->Include = parent.Filter->Include;
      }
    }

    if (parent.Filter->Exclude) {
      if (preset.Filter && preset.Filter->Exclude) {
        auto& exclude = *preset.Filter->Exclude;
        const auto& parentExclude = *parent.Filter->Exclude;
        InheritString(exclude.Name, parentExclude.Name);
        InheritString(exclude.Label, parentExclude.Label);
        InheritOptionalValue(exclude.Fixtures, parentExclude.Fixtures);
      } else {
        if (!preset.Filter) {
          preset.Filter.emplace();
        }
        preset.Filter->Exclude = parent.Filter->Exclude;
      }
    }
  }

  if (parent.Execution) {
    if (preset.Execution) {
      auto& execution = *preset.Execution;
      const auto& parentExecution = *parent.Execution;
      InheritOptionalValue(execution.StopOnFailure,
                           parentExecution.StopOnFailure);
      InheritOptionalValue(execution.EnableFailover,
                           parentExecution.EnableFailover);
      InheritOptionalValue(execution.Jobs, parentExecution.Jobs);
      InheritString(execution.ResourceSpecFile,
                    parentExecution.ResourceSpecFile);
      InheritOptionalValue(execution.TestLoad, parentExecution.TestLoad);
      InheritOptionalValue(execution.ShowOnly, parentExecution.ShowOnly);
      InheritOptionalValue(execution.Repeat, parentExecution.Repeat);
      InheritOptionalValue(execution.InteractiveDebugging,
                           parentExecution.InteractiveDebugging);
      InheritOptionalValue(execution.ScheduleRandom,
                           parentExecution.ScheduleRandom);
      InheritOptionalValue(execution.Timeout, parentExecution.Timeout);
      InheritOptionalValue(execution.NoTestsAction,
                           parentExecution.NoTestsAction);
    } else {
      preset.Execution = parent.Execution;
    }
  }

  return true;
}